

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O3

void VW::dealloc_example(_func_void_void_ptr *delete_label,example *ec,
                        _func_void_void_ptr *delete_prediction)

{
  char *__ptr;
  uchar *__ptr_00;
  long lVar1;
  
  if (delete_label != (_func_void_void_ptr *)0x0) {
    (*delete_label)(&ec->l);
  }
  if (delete_prediction != (_func_void_void_ptr *)0x0) {
    (*delete_prediction)(&ec->pred);
  }
  __ptr = (ec->tag)._begin;
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  (ec->tag)._begin = (char *)0x0;
  (ec->tag)._end = (char *)0x0;
  (ec->tag).end_array = (char *)0x0;
  if (ec->passthrough != (features *)0x0) {
    features::delete_v(ec->passthrough);
    operator_delete(ec->passthrough);
  }
  lVar1 = 0x20;
  do {
    features::delete_v((features *)((long)(ec->super_example_predict).feature_space + lVar1 + -0x20)
                      );
    lVar1 = lVar1 + 0x68;
  } while (lVar1 != 0x6820);
  __ptr_00 = (ec->super_example_predict).indices._begin;
  if (__ptr_00 != (uchar *)0x0) {
    free(__ptr_00);
  }
  (ec->super_example_predict).indices._begin = (uchar *)0x0;
  (ec->super_example_predict).indices._end = (uchar *)0x0;
  (ec->super_example_predict).indices.end_array = (uchar *)0x0;
  return;
}

Assistant:

void dealloc_example(void (*delete_label)(void*), example& ec, void (*delete_prediction)(void*))
{
  if (delete_label)
    delete_label(&ec.l);

  if (delete_prediction)
    delete_prediction(&ec.pred);

  ec.tag.delete_v();

  if (ec.passthrough)
  {
    ec.passthrough->delete_v();
    delete ec.passthrough;
  }

  for (size_t j = 0; j < 256; j++) ec.feature_space[j].delete_v();

  ec.indices.delete_v();
}